

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O2

var * __thiscall cs::runtime_type::parse_dot_lhs(runtime_type *this,var *a,token_base *b)

{
  bool bVar1;
  type_info *ptVar2;
  constant_values *pcVar3;
  var *pvVar4;
  shared_ptr<cs::name_space> *psVar5;
  type_t *this_00;
  structure *this_01;
  callable *pcVar6;
  namespace_t *pnVar7;
  runtime_error *prVar8;
  string local_88;
  allocator local_68 [64];
  
  ptVar2 = cs_impl::any::type(a);
  bVar1 = std::type_info::operator==(ptVar2,(type_info *)&constant_values::typeinfo);
  if (!bVar1) {
    ptVar2 = cs_impl::any::type(a);
    bVar1 = std::type_info::operator==
                      (ptVar2,(type_info *)&std::shared_ptr<cs::name_space>::typeinfo);
    if (bVar1) {
      psVar5 = cs_impl::any::val<std::shared_ptr<cs::name_space>>(a);
      pvVar4 = name_space::get_var((psVar5->
                                   super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>).
                                   _M_ptr,(var_id *)(b + 1));
      return pvVar4;
    }
    ptVar2 = cs_impl::any::type(a);
    bVar1 = std::type_info::operator==(ptVar2,(type_info *)&type_t::typeinfo);
    if (bVar1) {
      this_00 = cs_impl::any::const_val<cs::type_t>(a);
      pvVar4 = type_t::get_var<cs::var_id_const&>(this_00,(var_id *)(b + 1));
      return pvVar4;
    }
    ptVar2 = cs_impl::any::type(a);
    bVar1 = std::type_info::operator==(ptVar2,(type_info *)&structure::typeinfo);
    if (bVar1) {
      this_01 = cs_impl::any::val<cs::structure>(a);
      pvVar4 = structure::get_var<cs::var_id_const&>(this_01,(var_id *)(b + 1));
      ptVar2 = cs_impl::any::type(pvVar4);
      bVar1 = std::type_info::operator!=(ptVar2,(type_info *)&callable::typeinfo);
      if (!bVar1) {
        pcVar6 = cs_impl::any::const_val<cs::callable>(pvVar4);
        if (pcVar6->mType == member_fn) {
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string
                    ((string *)&local_88,"Can not visit member function as lvalue.",local_68);
          runtime_error::runtime_error(prVar8,&local_88);
          __cxa_throw(prVar8,&runtime_error::typeinfo,runtime_error::~runtime_error);
        }
      }
    }
    else {
      pnVar7 = cs_impl::any::get_ext(a);
      pvVar4 = name_space::get_var((pnVar7->
                                   super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>).
                                   _M_ptr,(var_id *)(b + 1));
      ptVar2 = cs_impl::any::type(pvVar4);
      bVar1 = std::type_info::operator==(ptVar2,(type_info *)&callable::typeinfo);
      if (bVar1) {
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&local_88,"Can not visit member function as lvalue.",local_68);
        runtime_error::runtime_error(prVar8,&local_88);
        __cxa_throw(prVar8,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
    }
    return pvVar4;
  }
  pcVar3 = cs_impl::any::const_val<cs::constant_values>(a);
  if (*pcVar3 == local_namepace) {
    pvVar4 = domain_manager::get_var_current<cs::var_id_const&>(&this->storage,(var_id *)(b + 1));
    return pvVar4;
  }
  if (*pcVar3 == global_namespace) {
    pvVar4 = domain_manager::get_var_global<cs::var_id_const&>(&this->storage,(var_id *)(b + 1));
    return pvVar4;
  }
  prVar8 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_88,"Unknown scope tag.",local_68);
  runtime_error::runtime_error(prVar8,&local_88);
  __cxa_throw(prVar8,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

var &runtime_type::parse_dot_lhs(const var &a, token_base *b)
	{
		if (a.type() == typeid(constant_values)) {
			switch (a.const_val<constant_values>()) {
			case constant_values::global_namespace:
				return storage.get_var_global(static_cast<token_id *>(b)->get_id());
			case constant_values::local_namepace:
				return storage.get_var_current(static_cast<token_id *>(b)->get_id());
			default:
				throw runtime_error("Unknown scope tag.");
			}
		}
		else if (a.type() == typeid(namespace_t))
			return a.val<namespace_t>()->get_var(static_cast<token_id *>(b)->get_id());
		else if (a.type() == typeid(type_t))
			return a.const_val<type_t>().get_var(static_cast<token_id *>(b)->get_id());
		else if (a.type() == typeid(structure)) {
			var &val = a.val<structure>().get_var(static_cast<token_id *>(b)->get_id());
			if (val.type() != typeid(callable) || !val.const_val<callable>().is_member_fn())
				return val;
			else
				throw runtime_error("Can not visit member function as lvalue.");
		}
		else {
			try {
				var &val = a.get_ext()->get_var(static_cast<token_id *>(b)->get_id());
				if (val.type() == typeid(callable))
					throw runtime_error("Can not visit member function as lvalue.");
				else
					return val;
			}
			catch (...) {
				if (a.type() == typeid(hash_map)) {
					auto &cmap = a.val<hash_map>();
					const string &str = static_cast<token_id *>(b)->get_id().get_id();
					if (cmap.count(str) == 0)
						throw runtime_error(std::string("Key \"") + str + "\" does not exist.");
					return cmap.at(str);
				}
				else
					throw;
			}
		}
	}